

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O1

bool __thiscall
Parameter<unsigned_long>::internalSetData<std::__cxx11::string>
          (Parameter<unsigned_long> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  pointer pcVar1;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar1 = (data->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + data->_M_string_length);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return false;
}

Assistant:

static bool convert(RepType v, RepType& r) {
    r = v;
    return true;
  }